

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O2

size_t absl::lts_20240722::container_internal::
       TypeErasedApplyToSlotFn<absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::vector<int,std::allocator<int>>>
                 (void *fn,void *slot)

{
  size_t sVar1;
  Hash<std::vector<int,_std::allocator<int>_>_> *f;
  
  sVar1 = hash_internal::MixingHashState::hash<std::vector<int,_std::allocator<int>_>,_0>
                    ((vector<int,_std::allocator<int>_> *)slot);
  return sVar1;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}